

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O0

void one_work(string *tmp,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
             *table_clone,char *key)

{
  bool bVar1;
  _Self local_68 [3];
  allocator local_49;
  string local_48 [32];
  _Self local_28;
  iterator it;
  char *key_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
  *table_clone_local;
  string *tmp_local;
  
  it._M_node = (_Base_ptr)key;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,key,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
       ::find(table_clone,(key_type *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BmsHeader>_>_>
       ::end(table_clone);
  bVar1 = std::operator!=(&local_28,local_68);
  if (bVar1) {
    introduceHeaderIter(tmp,(iterator)local_28._M_node);
    std::
    map<std::__cxx11::string,BmsHeader,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BmsHeader>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,BmsHeader,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BmsHeader>>>
                        *)table_clone,(iterator)local_28._M_node);
  }
  return;
}

Assistant:

static void
one_work(std::string& tmp, std::map<std::string, BmsHeader>& table_clone, const char* key)
{
	std::map<std::string, BmsHeader>::iterator it = table_clone.find(key);
	if (it != table_clone.end()) {
		introduceHeaderIter(tmp, it);
		table_clone.erase(it);
	}
}